

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O2

TA_RetCode TA_ParamHolderFree(TA_ParamHolder *paramsToFree)

{
  int *piVar1;
  TA_RetCode TVar2;
  
  TVar2 = TA_SUCCESS;
  if (paramsToFree != (TA_ParamHolder *)0x0) {
    piVar1 = (int *)paramsToFree->hiddenData;
    TVar2 = TA_INVALID_PARAM_HOLDER;
    if ((piVar1 != (int *)0x0) && (*piVar1 == -0x5dfd4dfe)) {
      free(*(void **)(piVar1 + 4));
      free(*(void **)(piVar1 + 2));
      free(*(void **)(piVar1 + 6));
      free(paramsToFree);
      TVar2 = TA_SUCCESS;
    }
  }
  return TVar2;
}

Assistant:

TA_RetCode TA_ParamHolderFree( TA_ParamHolder *paramsToFree )
{
   TA_ParamHolderPriv     *paramPriv;

   TA_ParamHolderInput    *input;
   TA_ParamHolderOptInput *optInput;
   TA_ParamHolderOutput   *output;

   if( !paramsToFree )
   {
      return TA_SUCCESS;
   }

   paramPriv = paramsToFree->hiddenData;

   if( !paramPriv )
   {
      return TA_INVALID_PARAM_HOLDER;
   }

   if( paramPriv->magicNumber != TA_PARAM_HOLDER_PRIV_MAGIC_NB )
   {
      return TA_INVALID_PARAM_HOLDER;
   }

   optInput = paramPriv->optIn;
   if( optInput )
      TA_Free( optInput );

   input = paramPriv->in;
   if( input )
      TA_Free( input );

   output = paramPriv->out;
   if( output )
      TA_Free( output );

   TA_Free( paramsToFree );

   return TA_SUCCESS;
}